

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_sse4.c
# Opt level: O0

int64_t aom_sse_sse4_1(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  int iVar1;
  undefined4 in_ESI;
  uint in_R8D;
  int in_R9D;
  int i_1;
  int i;
  __m128i sum;
  int64_t sse;
  int y;
  undefined4 local_60;
  undefined4 local_5c;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 in_stack_ffffffffffffffd8;
  __m128i *sum_00;
  uint8_t *b_00;
  uint8_t *in_stack_fffffffffffffff8;
  
  local_40 = 0;
  sum_00 = (__m128i *)0x0;
  b_00 = (uint8_t *)0x0;
  if (in_R8D == 4) {
    do {
      sse4x2_sse4_1((uint8_t *)CONCAT44(height,y),sse._4_4_,(uint8_t *)sum[1],sum[0]._4_4_,_i_1);
      local_40 = local_40 + 2;
    } while (local_40 < in_R9D);
    local_48 = summary_all_sse4((__m128i *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
  }
  else if (in_R8D == 8) {
    do {
      sse8_sse4_1(in_stack_fffffffffffffff8,b_00,sum_00);
      local_40 = local_40 + 1;
    } while (local_40 < in_R9D);
    local_48 = summary_all_sse4((__m128i *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
  }
  else if (in_R8D == 0x10) {
    do {
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      local_40 = local_40 + 1;
    } while (local_40 < in_R9D);
    local_48 = summary_all_sse4((__m128i *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
  }
  else if (in_R8D == 0x20) {
    do {
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      local_40 = local_40 + 1;
    } while (local_40 < in_R9D);
    local_48 = summary_all_sse4((__m128i *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
  }
  else if (in_R8D == 0x40) {
    do {
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      local_40 = local_40 + 1;
    } while (local_40 < in_R9D);
    local_48 = summary_all_sse4((__m128i *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
  }
  else if (in_R8D == 0x80) {
    do {
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      sse_w16_sse4_1((__m128i *)CONCAT44(height,y),(uint8_t *)CONCAT44(sse._4_4_,(undefined4)sse),
                     (uint8_t *)sum[1]);
      local_40 = local_40 + 1;
    } while (local_40 < in_R9D);
    local_48 = summary_all_sse4((__m128i *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
  }
  else {
    if ((in_R8D & 7) == 0) {
      do {
        local_60 = 0;
        do {
          sse8_sse4_1(in_stack_fffffffffffffff8,b_00,sum_00);
          local_60 = local_60 + 8;
        } while (local_60 < (int)in_R8D);
        local_40 = local_40 + 1;
      } while (local_40 < in_R9D);
    }
    else {
      do {
        local_5c = 0;
        do {
          sse8_sse4_1(in_stack_fffffffffffffff8,b_00,sum_00);
          sse8_sse4_1(in_stack_fffffffffffffff8,b_00,sum_00);
          iVar1 = local_5c + 0xc;
          local_5c = local_5c + 8;
        } while (iVar1 < (int)in_R8D);
        sse4x2_sse4_1((uint8_t *)CONCAT44(height,y),sse._4_4_,(uint8_t *)sum[1],sum[0]._4_4_,_i_1);
        local_40 = local_40 + 2;
      } while (local_40 < in_R9D);
    }
    local_48 = summary_all_sse4((__m128i *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
  }
  return local_48;
}

Assistant:

int64_t aom_sse_sse4_1(const uint8_t *a, int a_stride, const uint8_t *b,
                       int b_stride, int width, int height) {
  int y = 0;
  int64_t sse = 0;
  __m128i sum = _mm_setzero_si128();
  switch (width) {
    case 4:
      do {
        sse4x2_sse4_1(a, a_stride, b, b_stride, &sum);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 8:
      do {
        sse8_sse4_1(a, b, &sum);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 16:
      do {
        sse_w16_sse4_1(&sum, a, b);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 32:
      do {
        sse_w16_sse4_1(&sum, a, b);
        sse_w16_sse4_1(&sum, a + 16, b + 16);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 64:
      do {
        sse_w16_sse4_1(&sum, a, b);
        sse_w16_sse4_1(&sum, a + 16 * 1, b + 16 * 1);
        sse_w16_sse4_1(&sum, a + 16 * 2, b + 16 * 2);
        sse_w16_sse4_1(&sum, a + 16 * 3, b + 16 * 3);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 128:
      do {
        sse_w16_sse4_1(&sum, a, b);
        sse_w16_sse4_1(&sum, a + 16 * 1, b + 16 * 1);
        sse_w16_sse4_1(&sum, a + 16 * 2, b + 16 * 2);
        sse_w16_sse4_1(&sum, a + 16 * 3, b + 16 * 3);
        sse_w16_sse4_1(&sum, a + 16 * 4, b + 16 * 4);
        sse_w16_sse4_1(&sum, a + 16 * 5, b + 16 * 5);
        sse_w16_sse4_1(&sum, a + 16 * 6, b + 16 * 6);
        sse_w16_sse4_1(&sum, a + 16 * 7, b + 16 * 7);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    default:
      if (width & 0x07) {
        do {
          int i = 0;
          do {
            sse8_sse4_1(a + i, b + i, &sum);
            sse8_sse4_1(a + i + a_stride, b + i + b_stride, &sum);
            i += 8;
          } while (i + 4 < width);
          sse4x2_sse4_1(a + i, a_stride, b + i, b_stride, &sum);
          a += (a_stride << 1);
          b += (b_stride << 1);
          y += 2;
        } while (y < height);
      } else {
        do {
          int i = 0;
          do {
            sse8_sse4_1(a + i, b + i, &sum);
            i += 8;
          } while (i < width);
          a += a_stride;
          b += b_stride;
          y += 1;
        } while (y < height);
      }
      sse = summary_all_sse4(&sum);
      break;
  }

  return sse;
}